

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O3

void __thiscall
duckdb::SimpleFunction::SimpleFunction
          (SimpleFunction *this,string *name_p,vector<duckdb::LogicalType,_true> *arguments_p,
          LogicalType *varargs_p)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  pointer pLVar3;
  ulong *puVar4;
  ulong local_10;
  undefined8 uStack_8;
  
  puVar4 = (ulong *)(name_p->_M_dataplus)._M_p;
  paVar1 = &name_p->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar4 == paVar1) {
    local_10 = paVar1->_M_allocated_capacity;
    uStack_8 = *(undefined8 *)((long)&name_p->field_2 + 8);
    puVar4 = &local_10;
  }
  else {
    local_10 = paVar1->_M_allocated_capacity;
  }
  sVar2 = name_p->_M_string_length;
  (name_p->_M_dataplus)._M_p = (pointer)paVar1;
  name_p->_M_string_length = 0;
  (name_p->field_2)._M_local_buf[0] = '\0';
  paVar1 = &(this->super_Function).name.field_2;
  (this->super_Function).name._M_dataplus._M_p = (pointer)paVar1;
  if (puVar4 == &local_10) {
    paVar1->_M_allocated_capacity = local_10;
    *(undefined8 *)((long)&(this->super_Function).name.field_2 + 8) = uStack_8;
  }
  else {
    (this->super_Function).name._M_dataplus._M_p = (pointer)puVar4;
    (this->super_Function).name.field_2._M_allocated_capacity = local_10;
  }
  (this->super_Function).name._M_string_length = sVar2;
  local_10 = local_10 & 0xffffffffffffff00;
  (this->super_Function).extra_info._M_dataplus._M_p =
       (pointer)&(this->super_Function).extra_info.field_2;
  (this->super_Function).extra_info._M_string_length = 0;
  (this->super_Function).extra_info.field_2._M_local_buf[0] = '\0';
  (this->super_Function)._vptr_Function = (_func_int **)&PTR__SimpleFunction_01968b80;
  pLVar3 = (arguments_p->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->arguments).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start =
       (arguments_p->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->arguments).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = pLVar3;
  (this->arguments).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (arguments_p->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (arguments_p->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (arguments_p->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (arguments_p->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->original_arguments).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
  .super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->original_arguments).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
  .super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->original_arguments).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
  .super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  LogicalType::LogicalType(&this->varargs,varargs_p);
  return;
}

Assistant:

SimpleFunction::SimpleFunction(string name_p, vector<LogicalType> arguments_p, LogicalType varargs_p)
    : Function(std::move(name_p)), arguments(std::move(arguments_p)), varargs(std::move(varargs_p)) {
}